

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O2

int TPZFMatrix<double>::Substitution(double *ptr,int64_t rows,TPZFMatrix<double> *B)

{
  double dVar1;
  ulong uVar2;
  double *pdVar3;
  ulong uVar4;
  ulong uVar5;
  double *pdVar6;
  long lVar7;
  ulong uVar8;
  char *msg1;
  long lVar9;
  ulong uVar10;
  double *pdVar11;
  ulong uVar12;
  long lVar13;
  
  uVar2 = (B->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  uVar12 = (B->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
  if (uVar2 != rows) {
    Error("static::SubstitutionLU <incompatible dimensions>",(char *)0x0);
  }
  uVar4 = 0;
  if ((long)uVar12 < 1) {
    uVar12 = uVar4;
  }
  uVar5 = 0;
  if (0 < (long)uVar2) {
    uVar5 = uVar2;
  }
  pdVar11 = ptr;
  for (; uVar4 != uVar5; uVar4 = uVar4 + 1) {
    for (uVar8 = 0; uVar8 != uVar12; uVar8 = uVar8 + 1) {
      lVar9 = (uVar8 & 0xffffffff) * uVar2;
      pdVar6 = pdVar11;
      for (uVar10 = 0; uVar4 != uVar10; uVar10 = uVar10 + 1) {
        pdVar3 = B->fElem;
        pdVar3[lVar9 + uVar4] =
             pdVar3[lVar9 + uVar4] -
             *pdVar6 * *(double *)((long)pdVar3 + uVar10 * 8 + (uVar8 & 0xffffffff) * uVar2 * 8);
        pdVar6 = pdVar6 + rows;
      }
    }
    pdVar11 = pdVar11 + 1;
  }
  for (uVar4 = 0; uVar4 != uVar12; uVar4 = uVar4 + 1) {
    lVar9 = ((uVar4 & 0xffffffff) + 1) * uVar2;
    lVar13 = (uVar4 & 0xffffffff) * uVar2;
    uVar5 = uVar2;
    pdVar11 = (double *)((long)ptr + (rows * 8 + 8) * uVar2 + -8);
    while (0 < (long)uVar5) {
      uVar8 = uVar5 - 1;
      pdVar6 = pdVar11;
      lVar7 = lVar9;
      for (; (long)uVar5 < (long)uVar2; uVar5 = uVar5 + 1) {
        pdVar3 = B->fElem;
        pdVar3[lVar13 + uVar8] = pdVar3[lVar13 + uVar8] - *pdVar6 * pdVar3[lVar7];
        lVar7 = lVar7 + 1;
        pdVar6 = pdVar6 + rows;
      }
      lVar7 = uVar8 * (rows + 1);
      dVar1 = ptr[lVar7];
      if ((ABS(dVar1) < 1e-12) &&
         ((msg1 = "static::BackSub(SubstitutionLU) <Matrix is singular", dVar1 == 0.0 ||
          (msg1 = "static::BackSub(SubstitutionLU) <Matrix is singular even after Power Plus...",
          1e-12 < ABS(B->fElem[lVar13 + uVar8] - dVar1))))) {
        Error(msg1,(char *)0x0);
      }
      B->fElem[lVar13 + uVar8] = B->fElem[lVar13 + uVar8] / ptr[lVar7];
      lVar9 = lVar9 + -1;
      pdVar11 = (double *)((long)pdVar11 + (rows * 8 ^ 0xfffffffffffffff8U));
      uVar5 = uVar8;
    }
  }
  return 1;
}

Assistant:

int TPZFMatrix<TVar>::Substitution(const TVar *ptr, int64_t rows, TPZFMatrix<TVar> *B)
{
    int64_t rowb = B->Rows();
    int64_t colb = B->Cols();
    if ( rowb != rows ) Error( "static::SubstitutionLU <incompatible dimensions>" );
    int64_t i,j;
    for ( i = 0; i < rowb; i++ ) {
        for ( int64_t col = 0; col < colb; col++ )
            for (j = 0; j < i; j++ )
                //B->PutVal( i, col, B->GetVal(i, col) - GetVal(i, j) * B->GetVal(j, col) );
                PUTVAL(B, rowb, i, col, GETVAL(B, rowb, i, col) - SELECTEL(ptr, rows, i, j) * GETVAL(B, rowb, j, col));
    }
    
    for (int64_t col=0; col<colb; col++){
        for ( i = rowb-1; i >= 0; i-- ) {
            for (j = i+1; j < rowb ; j++ )
                //B->PutVal( i, col, B->GetVal(i, col) - GetVal(i, j) * B->GetVal(j, col) );
                PUTVAL(B, rowb, i, col, GETVAL(B, rowb, i, col) - SELECTEL(ptr, rows, i, j) * GETVAL(B, rowb, j, col));
            if ( IsZero( SELECTEL(ptr, rows, i, i)/*GetVal(i, i)*/ ) ) {
                if (fabs(SELECTEL(ptr, rows, i, i)/*GetVal(i, i)*/) > fabs((TVar)0.)) {
                    TVar tmp = GETVAL(B, rowb, i, col) - SELECTEL(ptr, rows, i, i);/*B->GetVal(i, col) - GetVal(i, i)*/
                    if (fabs(tmp) > fabs(((TVar)1e-12))) {
                        Error( "static::BackSub(SubstitutionLU) <Matrix is singular even after Power Plus..." );
                    }
                }else  Error( "static::BackSub(SubstitutionLU) <Matrix is singular" );
            }
            PUTVAL(B, rowb, i, col, GETVAL(B, rowb, i, col)/SELECTEL(ptr, rows, i, i));
            //B->PutVal( i, col, B->GetVal( i, col) / GetVal(i, i) );
        }
    }
    return( 1 );
}